

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref __thiscall
cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref,cashew::Ref>
          (ValueBuilder *this,IString target,Ref args,Ref args_1,Ref args_2,Ref args_3)

{
  Value *pVVar1;
  Ref RVar2;
  char *extraout_RDX;
  IString name;
  Ref local_90;
  Value *local_88;
  Value *local_80;
  size_t i;
  Ref argArray [4];
  Ref local_50;
  Ref callArgs;
  size_t nArgs;
  Ref args_local_3;
  Ref args_local_2;
  Ref args_local_1;
  Ref args_local;
  IString target_local;
  
  target_local.str._M_len = target.str._M_len;
  callArgs.inst = (Value *)0x4;
  local_50 = makeRawArray(4);
  i = (size_t)target.str._M_str;
  argArray[0].inst = args.inst;
  argArray[1].inst = args_1.inst;
  argArray[2].inst = args_2.inst;
  for (local_80 = (Value *)0x0; local_80 < callArgs.inst;
      local_80 = (Value *)((long)&local_80->type + 1)) {
    pVVar1 = Ref::operator->(&local_50);
    local_88 = argArray[(long)&local_80[-1].field_1.num + 0xf].inst;
    cashew::Value::push_back(pVVar1,(Ref)local_88);
  }
  local_90 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_90);
  RVar2 = makeRawString((IString *)CALL);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  name.str._M_str = extraout_RDX;
  name.str._M_len = target_local.str._M_len;
  RVar2 = makeName(this,name);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  pVVar1 = cashew::Value::push_back(pVVar1,local_50);
  Ref::Ref((Ref *)&target_local.str._M_str,pVVar1);
  return (Ref)(Value *)target_local.str._M_str;
}

Assistant:

static Ref makeCall(IString target, Ts... args) {
    size_t nArgs = sizeof...(Ts);
    Ref callArgs = makeRawArray(nArgs);
    Ref argArray[] = {args...};
    for (size_t i = 0; i < nArgs; ++i) {
      callArgs->push_back(argArray[i]);
    }
    return &makeRawArray(3)
              ->push_back(makeRawString(CALL))
              .push_back(makeName(target))
              .push_back(callArgs);
  }